

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O3

void __thiscall
FTraceInfo::EnterSectorPortal
          (FTraceInfo *this,FPathTraverse *pt,int position,double frac,sector_t_conflict *entersec)

{
  _func_ETraceStatus_FTraceResults_ptr_void_ptr *p_Var1;
  FTraceResults *pFVar2;
  undefined1 auVar3 [16];
  double x;
  double y;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  subsector_t *psVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dStack_50;
  
  dVar14 = this->MaxDist * frac;
  dVar7 = (this->Start).X;
  dVar8 = (this->Start).Y;
  dVar13 = (this->Vec).Z * dVar14 + (this->Start).Z;
  dVar15 = dVar14 * (this->Vec).X + dVar7;
  dVar16 = dVar14 * (this->Vec).Y + dVar8;
  dVar5 = sectorPortals.Array[entersec->Portals[position]].mDisplacement.X;
  dVar6 = sectorPortals.Array[entersec->Portals[position]].mDisplacement.Y;
  x = dVar5 + dVar15;
  y = dVar6 + dVar16;
  dVar5 = dVar5 + dVar7;
  dVar6 = dVar6 + dVar8;
  auVar4._8_4_ = SUB84(dVar6,0);
  auVar4._0_8_ = dVar5;
  auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
  (this->Start).X = dVar5;
  (this->Start).Y = (double)auVar4._8_8_;
  auVar3._8_4_ = SUB84(y,0);
  auVar3._0_8_ = x;
  auVar3._12_4_ = (int)((ulong)y >> 0x20);
  psVar12 = P_PointInSubsector(x,y);
  this->CurSector = psVar12->sector;
  this->inshootthrough = 1;
  this->startfrac = frac;
  this->EnterDist = dVar14;
  FPathTraverse::PortalRelocate
            (pt,&sectorPortals.Array[entersec->Portals[position]].mDisplacement,this->ptflags,frac);
  if (((this->TraceFlags & 0x10) != 0) &&
     (p_Var1 = this->TraceCallback, p_Var1 != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0))
  {
    pFVar2 = this->Results;
    pFVar2->HitType = TRACE_CrossingPortal;
    (pFVar2->HitPos).Z = dVar13;
    (pFVar2->HitPos).X = dVar15;
    (pFVar2->HitPos).Y = dVar16;
    (pFVar2->SrcFromTarget).Z = dVar13;
    dStack_50 = auVar3._8_8_;
    (pFVar2->SrcFromTarget).X = x;
    (pFVar2->SrcFromTarget).Y = dStack_50;
    (pFVar2->HitVector).Z = (this->Vec).Z;
    uVar9 = *(undefined4 *)((long)&(this->Vec).X + 4);
    uVar10 = *(undefined4 *)&(this->Vec).Y;
    uVar11 = *(undefined4 *)((long)&(this->Vec).Y + 4);
    *(undefined4 *)&(pFVar2->HitVector).X = *(undefined4 *)&(this->Vec).X;
    *(undefined4 *)((long)&(pFVar2->HitVector).X + 4) = uVar9;
    *(undefined4 *)&(pFVar2->HitVector).Y = uVar10;
    *(undefined4 *)((long)&(pFVar2->HitVector).Y + 4) = uVar11;
    (*p_Var1)(pFVar2,this->TraceCallbackData);
  }
  Setup3DFloors(this);
  return;
}

Assistant:

void FTraceInfo::EnterSectorPortal(FPathTraverse &pt, int position, double frac, sector_t *entersec)
{
	DVector2 displacement = entersec->GetPortalDisplacement(position);;
	double enterdist = MaxDist * frac;
	DVector3 exit = Start + enterdist * Vec;
	DVector3 enter = exit + displacement;

	Start += displacement;
	CurSector = P_PointInSector(enter);
	inshootthrough = true;
	startfrac = frac;
	EnterDist = enterdist;
	pt.PortalRelocate(entersec->GetPortal(position)->mDisplacement, ptflags, frac);

	if ((TraceFlags & TRACE_ReportPortals) && TraceCallback != NULL)
	{
		enterdist = MaxDist * frac;
		Results->HitType = TRACE_CrossingPortal;
		Results->HitPos = exit;
		Results->SrcFromTarget = enter;
		Results->HitVector = Vec;
		TraceCallback(*Results, TraceCallbackData);
	}

	Setup3DFloors();
}